

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::MessageGenerator::Generate
          (MessageGenerator *this,Printer *printer)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  Descriptor *pDVar5;
  FileDescriptor *this_00;
  FileOptions *this_01;
  char *pcVar6;
  string *psVar7;
  EnumDescriptor *descriptor;
  FieldDescriptor *pFVar8;
  FieldGenerator *pFVar9;
  string *value2;
  int i_00;
  Descriptor *descriptor_00;
  Descriptor *descriptor_01;
  ulong uVar10;
  ulong extraout_RDX;
  FieldDescriptor *field;
  SubstituteArg *in_stack_fffffffffffff788;
  bool local_689;
  ExtensionGenerator local_688;
  int local_660;
  int local_65c;
  int i_6;
  int i_5;
  string local_638;
  int local_614;
  undefined1 local_610 [4];
  int i_4;
  uint local_5f0;
  int local_5ec;
  int i_3;
  int totalInts;
  int i_2;
  int totalBits;
  MessageGenerator messageGenerator;
  undefined1 local_5b8 [4];
  int i_1;
  int local_580;
  allocator<char> local_579;
  int i;
  allocator<char> local_551;
  string local_550;
  allocator<char> local_529;
  string local_528;
  allocator<char> local_501;
  string local_500;
  SubstituteArg local_4e0;
  SubstituteArg local_4b0;
  SubstituteArg local_480;
  SubstituteArg local_450;
  SubstituteArg local_420;
  SubstituteArg local_3f0;
  SubstituteArg local_3c0;
  SubstituteArg local_390;
  SubstituteArg local_360;
  string local_330;
  SubstituteArg local_310;
  string local_2e0;
  allocator<char> local_2b9;
  string local_2b8;
  SubstituteArg local_298;
  SubstituteArg local_268;
  SubstituteArg local_238;
  SubstituteArg local_208;
  SubstituteArg local_1d8;
  SubstituteArg local_1a8;
  SubstituteArg local_178;
  SubstituteArg local_148;
  SubstituteArg local_118;
  string local_e8;
  SubstituteArg local_c8;
  string local_98;
  allocator<char> local_71;
  string local_70;
  undefined1 local_40 [8];
  string builder_type;
  bool is_own_file;
  Printer *printer_local;
  MessageGenerator *this_local;
  
  pDVar5 = Descriptor::containing_type(this->descriptor_);
  local_689 = false;
  if (pDVar5 == (Descriptor *)0x0) {
    this_00 = Descriptor::file(this->descriptor_);
    this_01 = FileDescriptor::options(this_00);
    local_689 = FileOptions::java_multiple_files(this_01);
  }
  builder_type.field_2._M_local_buf[0xf] = local_689;
  WriteMessageDocComment(printer,this->descriptor_);
  std::__cxx11::string::string((string *)local_40);
  iVar2 = Descriptor::extension_range_count(this->descriptor_);
  if (iVar2 < 1) {
    bVar1 = HasDescriptorMethods(this->descriptor_);
    if (bVar1) {
      pcVar6 = "static";
      if ((builder_type.field_2._M_local_buf[0xf] & 1U) != 0) {
        pcVar6 = "";
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_500,pcVar6,&local_501);
      psVar7 = Descriptor::name_abi_cxx11_(this->descriptor_);
      io::Printer::Print(printer,
                         "public $static$ final class $classname$ extends\n    com.google.protobuf.GeneratedMessage\n    implements $classname$OrBuilder {\n"
                         ,"static",&local_500,"classname",psVar7);
      std::__cxx11::string::~string((string *)&local_500);
      std::allocator<char>::~allocator(&local_501);
      std::__cxx11::string::operator=
                ((string *)local_40,"com.google.protobuf.GeneratedMessage.Builder<?>");
    }
    else {
      pcVar6 = "static";
      if ((builder_type.field_2._M_local_buf[0xf] & 1U) != 0) {
        pcVar6 = "";
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_528,pcVar6,&local_529);
      psVar7 = Descriptor::name_abi_cxx11_(this->descriptor_);
      io::Printer::Print(printer,
                         "public $static$ final class $classname$ extends\n    com.google.protobuf.GeneratedMessageLite\n    implements $classname$OrBuilder {\n"
                         ,"static",&local_528,"classname",psVar7);
      std::__cxx11::string::~string((string *)&local_528);
      std::allocator<char>::~allocator(&local_529);
      std::__cxx11::string::operator=
                ((string *)local_40,"com.google.protobuf.GeneratedMessageLite.Builder");
    }
  }
  else {
    bVar1 = HasDescriptorMethods(this->descriptor_);
    if (bVar1) {
      pcVar6 = "static";
      if ((builder_type.field_2._M_local_buf[0xf] & 1U) != 0) {
        pcVar6 = "";
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,pcVar6,&local_71);
      psVar7 = Descriptor::name_abi_cxx11_(this->descriptor_);
      io::Printer::Print(printer,
                         "public $static$ final class $classname$ extends\n    com.google.protobuf.GeneratedMessage.ExtendableMessage<\n      $classname$> implements $classname$OrBuilder {\n"
                         ,"static",&local_70,"classname",psVar7);
      std::__cxx11::string::~string((string *)&local_70);
      std::allocator<char>::~allocator(&local_71);
      ClassName_abi_cxx11_(&local_e8,(java *)this->descriptor_,descriptor_00);
      strings::internal::SubstituteArg::SubstituteArg(&local_c8,&local_e8);
      strings::internal::SubstituteArg::SubstituteArg(&local_118);
      strings::internal::SubstituteArg::SubstituteArg(&local_148);
      strings::internal::SubstituteArg::SubstituteArg(&local_178);
      strings::internal::SubstituteArg::SubstituteArg(&local_1a8);
      strings::internal::SubstituteArg::SubstituteArg(&local_1d8);
      strings::internal::SubstituteArg::SubstituteArg(&local_208);
      strings::internal::SubstituteArg::SubstituteArg(&local_238);
      strings::internal::SubstituteArg::SubstituteArg(&local_268);
      strings::internal::SubstituteArg::SubstituteArg(&local_298);
      strings::Substitute_abi_cxx11_
                (&local_98,
                 (strings *)"com.google.protobuf.GeneratedMessage.ExtendableBuilder<$0, ?>",
                 (char *)&local_c8,&local_118,&local_148,&local_178,&local_1a8,&local_1d8,&local_208
                 ,&local_238,&local_268,&local_298,in_stack_fffffffffffff788);
      std::__cxx11::string::operator=((string *)local_40,(string *)&local_98);
      std::__cxx11::string::~string((string *)&local_98);
      std::__cxx11::string::~string((string *)&local_e8);
    }
    else {
      pcVar6 = "static";
      if ((builder_type.field_2._M_local_buf[0xf] & 1U) != 0) {
        pcVar6 = "";
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_2b8,pcVar6,&local_2b9);
      psVar7 = Descriptor::name_abi_cxx11_(this->descriptor_);
      io::Printer::Print(printer,
                         "public $static$ final class $classname$ extends\n    com.google.protobuf.GeneratedMessageLite.ExtendableMessage<\n      $classname$> implements $classname$OrBuilder {\n"
                         ,"static",&local_2b8,"classname",psVar7);
      std::__cxx11::string::~string((string *)&local_2b8);
      std::allocator<char>::~allocator(&local_2b9);
      ClassName_abi_cxx11_(&local_330,(java *)this->descriptor_,descriptor_01);
      strings::internal::SubstituteArg::SubstituteArg(&local_310,&local_330);
      strings::internal::SubstituteArg::SubstituteArg(&local_360);
      strings::internal::SubstituteArg::SubstituteArg(&local_390);
      strings::internal::SubstituteArg::SubstituteArg(&local_3c0);
      strings::internal::SubstituteArg::SubstituteArg(&local_3f0);
      strings::internal::SubstituteArg::SubstituteArg(&local_420);
      strings::internal::SubstituteArg::SubstituteArg(&local_450);
      strings::internal::SubstituteArg::SubstituteArg(&local_480);
      strings::internal::SubstituteArg::SubstituteArg(&local_4b0);
      strings::internal::SubstituteArg::SubstituteArg(&local_4e0);
      strings::Substitute_abi_cxx11_
                (&local_2e0,
                 (strings *)"com.google.protobuf.GeneratedMessageLite.ExtendableBuilder<$0, ?>",
                 (char *)&local_310,&local_360,&local_390,&local_3c0,&local_3f0,&local_420,
                 &local_450,&local_480,&local_4b0,&local_4e0,in_stack_fffffffffffff788);
      std::__cxx11::string::operator=((string *)local_40,(string *)&local_2e0);
      std::__cxx11::string::~string((string *)&local_2e0);
      std::__cxx11::string::~string((string *)&local_330);
    }
  }
  io::Printer::Indent(printer);
  psVar7 = Descriptor::name_abi_cxx11_(this->descriptor_);
  bVar1 = HasUnknownFields(this->descriptor_);
  pcVar6 = "";
  if (bVar1) {
    pcVar6 = "  this.unknownFields = builder.getUnknownFields();";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_550,pcVar6,&local_551);
  io::Printer::Print(printer,
                     "// Use $classname$.newBuilder() to construct.\nprivate $classname$($buildertype$ builder) {\n  super(builder);\n$set_unknown_fields$\n}\n"
                     ,"classname",psVar7,"buildertype",(string *)local_40,"set_unknown_fields",
                     &local_550);
  std::__cxx11::string::~string((string *)&local_550);
  std::allocator<char>::~allocator(&local_551);
  psVar7 = Descriptor::name_abi_cxx11_(this->descriptor_);
  bVar1 = HasUnknownFields(this->descriptor_);
  pcVar6 = "";
  if (bVar1) {
    pcVar6 = " this.unknownFields = com.google.protobuf.UnknownFieldSet.getDefaultInstance(); ";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&i,pcVar6,&local_579);
  io::Printer::Print(printer,
                     "private $classname$(boolean noInit) {$set_default_unknown_fields$}\n\nprivate static final $classname$ defaultInstance;\npublic static $classname$ getDefaultInstance() {\n  return defaultInstance;\n}\n\npublic $classname$ getDefaultInstanceForType() {\n  return defaultInstance;\n}\n\n"
                     ,"classname",psVar7,"set_default_unknown_fields",(string *)&i);
  std::__cxx11::string::~string((string *)&i);
  std::allocator<char>::~allocator(&local_579);
  bVar1 = HasUnknownFields(this->descriptor_);
  if (bVar1) {
    io::Printer::Print(printer,
                       "private final com.google.protobuf.UnknownFieldSet unknownFields;\n@java.lang.Override\npublic final com.google.protobuf.UnknownFieldSet\n    getUnknownFields() {\n  return this.unknownFields;\n}\n"
                      );
  }
  bVar1 = HasGeneratedMethods(this->descriptor_);
  if (bVar1) {
    GenerateParsingConstructor(this,printer);
  }
  GenerateDescriptorMethods(this,printer);
  GenerateParser(this,printer);
  for (local_580 = 0; iVar2 = local_580, iVar3 = Descriptor::enum_type_count(this->descriptor_),
      iVar2 < iVar3; local_580 = local_580 + 1) {
    descriptor = Descriptor::enum_type(this->descriptor_,local_580);
    EnumGenerator::EnumGenerator((EnumGenerator *)local_5b8,descriptor);
    EnumGenerator::Generate((EnumGenerator *)local_5b8,printer);
    EnumGenerator::~EnumGenerator((EnumGenerator *)local_5b8);
  }
  for (messageGenerator.field_generators_.extension_generators_.array_._4_4_ = 0;
      iVar2 = messageGenerator.field_generators_.extension_generators_.array_._4_4_,
      iVar3 = Descriptor::nested_type_count(this->descriptor_), iVar2 < iVar3;
      messageGenerator.field_generators_.extension_generators_.array_._4_4_ =
           messageGenerator.field_generators_.extension_generators_.array_._4_4_ + 1) {
    pDVar5 = Descriptor::nested_type
                       (this->descriptor_,
                        messageGenerator.field_generators_.extension_generators_.array_._4_4_);
    MessageGenerator((MessageGenerator *)&i_2,pDVar5);
    GenerateInterface((MessageGenerator *)&i_2,printer);
    Generate((MessageGenerator *)&i_2,printer);
    ~MessageGenerator((MessageGenerator *)&i_2);
  }
  totalInts = 0;
  for (i_3 = 0; iVar2 = i_3, iVar3 = Descriptor::field_count(this->descriptor_), iVar2 < iVar3;
      i_3 = i_3 + 1) {
    pFVar8 = Descriptor::field(this->descriptor_,i_3);
    pFVar9 = FieldGeneratorMap::get(&this->field_generators_,pFVar8);
    iVar2 = (*pFVar9->_vptr_FieldGenerator[2])();
    totalInts = iVar2 + totalInts;
  }
  local_5ec = (totalInts + 0x1f) / 0x20;
  uVar10 = (long)(totalInts + 0x1f) % 0x20 & 0xffffffff;
  for (local_5f0 = 0; (int)local_5f0 < local_5ec; local_5f0 = local_5f0 + 1) {
    GetBitFieldName_abi_cxx11_((string *)local_610,(java *)(ulong)local_5f0,(int)uVar10);
    io::Printer::Print(printer,"private int $bit_field_name$;\n","bit_field_name",
                       (string *)local_610);
    std::__cxx11::string::~string((string *)local_610);
    uVar10 = extraout_RDX;
  }
  for (local_614 = 0; iVar2 = local_614, iVar3 = Descriptor::field_count(this->descriptor_),
      iVar2 < iVar3; local_614 = local_614 + 1) {
    pFVar8 = Descriptor::field(this->descriptor_,local_614);
    anon_unknown_5::PrintFieldComment(printer,pFVar8);
    pFVar8 = Descriptor::field(this->descriptor_,local_614);
    FieldConstantName_abi_cxx11_(&local_638,(java *)pFVar8,field);
    pFVar8 = Descriptor::field(this->descriptor_,local_614);
    uVar4 = FieldDescriptor::number(pFVar8);
    SimpleItoa_abi_cxx11_((string *)&i_6,(protobuf *)(ulong)uVar4,i_00);
    io::Printer::Print(printer,"public static final int $constant_name$ = $number$;\n",
                       "constant_name",&local_638,"number",(string *)&i_6);
    std::__cxx11::string::~string((string *)&i_6);
    std::__cxx11::string::~string((string *)&local_638);
    pFVar8 = Descriptor::field(this->descriptor_,local_614);
    pFVar9 = FieldGeneratorMap::get(&this->field_generators_,pFVar8);
    (*pFVar9->_vptr_FieldGenerator[5])(pFVar9,printer);
    io::Printer::Print(printer,"\n");
  }
  io::Printer::Print(printer,"private void initFields() {\n");
  io::Printer::Indent(printer);
  for (local_65c = 0; iVar2 = local_65c, iVar3 = Descriptor::field_count(this->descriptor_),
      iVar2 < iVar3; local_65c = local_65c + 1) {
    pFVar8 = Descriptor::field(this->descriptor_,local_65c);
    pFVar9 = FieldGeneratorMap::get(&this->field_generators_,pFVar8);
    (*pFVar9->_vptr_FieldGenerator[7])(pFVar9,printer);
  }
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,"}\n");
  bVar1 = HasGeneratedMethods(this->descriptor_);
  if (bVar1) {
    GenerateIsInitialized(this,printer,MEMOIZE);
    GenerateMessageSerializationMethods(this,printer);
  }
  bVar1 = HasEqualsAndHashCode(this->descriptor_);
  if (bVar1) {
    GenerateEqualsAndHashCode(this,printer);
  }
  GenerateParseFromMethods(this,printer);
  GenerateBuilder(this,printer);
  psVar7 = Descriptor::name_abi_cxx11_(this->descriptor_);
  value2 = Descriptor::full_name_abi_cxx11_(this->descriptor_);
  io::Printer::Print(printer,
                     "\nstatic {\n  defaultInstance = new $classname$(true);\n  defaultInstance.initFields();\n}\n\n// @@protoc_insertion_point(class_scope:$full_name$)\n"
                     ,"classname",psVar7,"full_name",value2);
  for (local_660 = 0; iVar2 = local_660, iVar3 = Descriptor::extension_count(this->descriptor_),
      iVar2 < iVar3; local_660 = local_660 + 1) {
    pFVar8 = Descriptor::extension(this->descriptor_,local_660);
    ExtensionGenerator::ExtensionGenerator(&local_688,pFVar8);
    ExtensionGenerator::Generate(&local_688,printer);
    ExtensionGenerator::~ExtensionGenerator(&local_688);
  }
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,"}\n\n");
  std::__cxx11::string::~string((string *)local_40);
  return;
}

Assistant:

void MessageGenerator::Generate(io::Printer* printer) {
  bool is_own_file =
    descriptor_->containing_type() == NULL &&
    descriptor_->file()->options().java_multiple_files();

  WriteMessageDocComment(printer, descriptor_);

  // The builder_type stores the super type name of the nested Builder class.
  string builder_type;
  if (descriptor_->extension_range_count() > 0) {
    if (HasDescriptorMethods(descriptor_)) {
      printer->Print(
        "public $static$ final class $classname$ extends\n"
        "    com.google.protobuf.GeneratedMessage.ExtendableMessage<\n"
        "      $classname$> implements $classname$OrBuilder {\n",
        "static", is_own_file ? "" : "static",
        "classname", descriptor_->name());
      builder_type = strings::Substitute(
          "com.google.protobuf.GeneratedMessage.ExtendableBuilder<$0, ?>",
          ClassName(descriptor_));
    } else {
      printer->Print(
        "public $static$ final class $classname$ extends\n"
        "    com.google.protobuf.GeneratedMessageLite.ExtendableMessage<\n"
        "      $classname$> implements $classname$OrBuilder {\n",
        "static", is_own_file ? "" : "static",
        "classname", descriptor_->name());
      builder_type = strings::Substitute(
          "com.google.protobuf.GeneratedMessageLite.ExtendableBuilder<$0, ?>",
          ClassName(descriptor_));
    }
  } else {
    if (HasDescriptorMethods(descriptor_)) {
      printer->Print(
        "public $static$ final class $classname$ extends\n"
        "    com.google.protobuf.GeneratedMessage\n"
        "    implements $classname$OrBuilder {\n",
        "static", is_own_file ? "" : "static",
        "classname", descriptor_->name());
      builder_type = "com.google.protobuf.GeneratedMessage.Builder<?>";
    } else {
      printer->Print(
        "public $static$ final class $classname$ extends\n"
        "    com.google.protobuf.GeneratedMessageLite\n"
        "    implements $classname$OrBuilder {\n",
        "static", is_own_file ? "" : "static",
        "classname", descriptor_->name());
      builder_type = "com.google.protobuf.GeneratedMessageLite.Builder";
    }
  }
  printer->Indent();
  // Using builder_type, instead of Builder, prevents the Builder class from
  // being loaded into PermGen space when the default instance is created.
  // This optimizes the PermGen space usage for clients that do not modify
  // messages.
  printer->Print(
    "// Use $classname$.newBuilder() to construct.\n"
    "private $classname$($buildertype$ builder) {\n"
    "  super(builder);\n"
    "$set_unknown_fields$\n"
    "}\n",
    "classname", descriptor_->name(),
    "buildertype", builder_type,
    "set_unknown_fields", HasUnknownFields(descriptor_)
        ? "  this.unknownFields = builder.getUnknownFields();" : "");
  printer->Print(
    // Used when constructing the default instance, which cannot be initialized
    // immediately because it may cyclically refer to other default instances.
    "private $classname$(boolean noInit) {$set_default_unknown_fields$}\n"
    "\n"
    "private static final $classname$ defaultInstance;\n"
    "public static $classname$ getDefaultInstance() {\n"
    "  return defaultInstance;\n"
    "}\n"
    "\n"
    "public $classname$ getDefaultInstanceForType() {\n"
    "  return defaultInstance;\n"
    "}\n"
    "\n",
    "classname", descriptor_->name(),
    "set_default_unknown_fields", HasUnknownFields(descriptor_)
        ? " this.unknownFields ="
          " com.google.protobuf.UnknownFieldSet.getDefaultInstance(); " : "");

  if (HasUnknownFields(descriptor_)) {
    printer->Print(
        "private final com.google.protobuf.UnknownFieldSet unknownFields;\n"
        ""
        "@java.lang.Override\n"
        "public final com.google.protobuf.UnknownFieldSet\n"
        "    getUnknownFields() {\n"
        "  return this.unknownFields;\n"
        "}\n");
  }

  if (HasGeneratedMethods(descriptor_)) {
    GenerateParsingConstructor(printer);
  }

  GenerateDescriptorMethods(printer);
  GenerateParser(printer);

  // Nested types
  for (int i = 0; i < descriptor_->enum_type_count(); i++) {
    EnumGenerator(descriptor_->enum_type(i)).Generate(printer);
  }

  for (int i = 0; i < descriptor_->nested_type_count(); i++) {
    MessageGenerator messageGenerator(descriptor_->nested_type(i));
    messageGenerator.GenerateInterface(printer);
    messageGenerator.Generate(printer);
  }

  // Integers for bit fields.
  int totalBits = 0;
  for (int i = 0; i < descriptor_->field_count(); i++) {
    totalBits += field_generators_.get(descriptor_->field(i))
        .GetNumBitsForMessage();
  }
  int totalInts = (totalBits + 31) / 32;
  for (int i = 0; i < totalInts; i++) {
    printer->Print("private int $bit_field_name$;\n",
      "bit_field_name", GetBitFieldName(i));
  }

  // Fields
  for (int i = 0; i < descriptor_->field_count(); i++) {
    PrintFieldComment(printer, descriptor_->field(i));
    printer->Print("public static final int $constant_name$ = $number$;\n",
      "constant_name", FieldConstantName(descriptor_->field(i)),
      "number", SimpleItoa(descriptor_->field(i)->number()));
    field_generators_.get(descriptor_->field(i)).GenerateMembers(printer);
    printer->Print("\n");
  }

  // Called by the constructor, except in the case of the default instance,
  // in which case this is called by static init code later on.
  printer->Print("private void initFields() {\n");
  printer->Indent();
  for (int i = 0; i < descriptor_->field_count(); i++) {
    field_generators_.get(descriptor_->field(i))
                     .GenerateInitializationCode(printer);
  }
  printer->Outdent();
  printer->Print("}\n");

  if (HasGeneratedMethods(descriptor_)) {
    GenerateIsInitialized(printer, MEMOIZE);
    GenerateMessageSerializationMethods(printer);
  }

  if (HasEqualsAndHashCode(descriptor_)) {
    GenerateEqualsAndHashCode(printer);
  }

  GenerateParseFromMethods(printer);
  GenerateBuilder(printer);

  // Carefully initialize the default instance in such a way that it doesn't
  // conflict with other initialization.
  printer->Print(
    "\n"
    "static {\n"
    "  defaultInstance = new $classname$(true);\n"
    "  defaultInstance.initFields();\n"
    "}\n"
    "\n"
    "// @@protoc_insertion_point(class_scope:$full_name$)\n",
    "classname", descriptor_->name(),
    "full_name", descriptor_->full_name());

  // Extensions must be declared after the defaultInstance is initialized
  // because the defaultInstance is used by the extension to lazily retrieve
  // the outer class's FileDescriptor.
  for (int i = 0; i < descriptor_->extension_count(); i++) {
    ExtensionGenerator(descriptor_->extension(i)).Generate(printer);
  }

  printer->Outdent();
  printer->Print("}\n\n");
}